

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse_array.c
# Opt level: O2

void opj_sparse_array_int32_free(opj_sparse_array_int32_t *sa)

{
  OPJ_INT32 *ptr;
  ulong uVar1;
  
  if (sa != (opj_sparse_array_int32_t *)0x0) {
    for (uVar1 = 0; uVar1 < sa->block_count_ver * sa->block_count_hor; uVar1 = uVar1 + 1) {
      ptr = sa->data_blocks[uVar1];
      if (ptr != (OPJ_INT32 *)0x0) {
        opj_free(ptr);
      }
    }
    opj_free(sa->data_blocks);
    opj_free(sa);
    return;
  }
  return;
}

Assistant:

void opj_sparse_array_int32_free(opj_sparse_array_int32_t* sa)
{
    if (sa) {
        OPJ_UINT32 i;
        for (i = 0; i < sa->block_count_hor * sa->block_count_ver; i++) {
            if (sa->data_blocks[i]) {
                opj_free(sa->data_blocks[i]);
            }
        }
        opj_free(sa->data_blocks);
        opj_free(sa);
    }
}